

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O0

void __thiscall
ezc3d::ParametersNS::Parameters::setMandatoryParametersForSpecialGroup
          (Parameters *this,string *groupName)

{
  initializer_list<int> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  int iVar2;
  Group *pGVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *in_RSI;
  Parameter p_4;
  Parameter p_3;
  Parameter p_2;
  Parameter p_1;
  Parameter p;
  Group *grp;
  string *in_stack_fffffffffffff618;
  Parameter *in_stack_fffffffffffff620;
  Parameter *pPVar4;
  string *in_stack_fffffffffffff630;
  Group *in_stack_fffffffffffff638;
  string *name;
  Parameter *in_stack_fffffffffffff640;
  Parameter *in_stack_fffffffffffff650;
  Parameter *in_stack_fffffffffffff658;
  Parameter *p_00;
  Parameter *in_stack_fffffffffffff660;
  undefined8 in_stack_fffffffffffff698;
  int data;
  Parameter *in_stack_fffffffffffff6a0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff6b0;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff6b8;
  Parameter *in_stack_fffffffffffff6c0;
  undefined1 local_858 [79];
  undefined1 local_809 [40];
  undefined1 local_7e1 [216];
  undefined1 local_709 [33];
  undefined1 local_6e8 [80];
  string local_698 [39];
  allocator<char> local_671;
  string local_670 [215];
  allocator<char> local_599;
  string local_598 [32];
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  allocator<char> local_539;
  string local_538 [39];
  allocator<char> local_511;
  string local_510 [39];
  allocator<char> local_4e9;
  string local_4e8 [39];
  allocator<char> local_4c1;
  string local_4c0 [215];
  allocator<char> local_3e9;
  string local_3e8 [32];
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined4 local_38c;
  undefined4 *local_388;
  undefined8 local_380;
  allocator<char> local_371;
  string local_370 [39];
  allocator<char> local_349;
  string local_348 [215];
  allocator<char> local_271;
  string local_270 [39];
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [215];
  allocator<char> local_149;
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [32];
  Group *local_100;
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [151];
  allocator<char> local_31;
  string local_30 [48];
  
  data = (int)((ulong)in_stack_fffffffffffff698 >> 0x20);
  iVar2 = std::__cxx11::string::compare(in_RSI);
  if (iVar2 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
               (allocator<char> *)in_stack_fffffffffffff650);
    bVar1 = isGroup((Parameters *)in_stack_fffffffffffff638,in_stack_fffffffffffff630);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      GroupNS::Group::Group
                ((Group *)in_stack_fffffffffffff640,&in_stack_fffffffffffff638->_name,
                 in_stack_fffffffffffff630);
      group((Parameters *)in_stack_fffffffffffff660,(Group *)in_stack_fffffffffffff658);
      GroupNS::Group::~Group((Group *)in_stack_fffffffffffff620);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator(&local_c9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
               (allocator<char> *)in_stack_fffffffffffff650);
    pGVar3 = group((Parameters *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
    local_100 = pGVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
               (allocator<char> *)in_stack_fffffffffffff650);
    bVar1 = GroupNS::Group::isParameter(in_stack_fffffffffffff638,in_stack_fffffffffffff630);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator(&local_149);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      GroupNS::Parameter::Parameter
                (in_stack_fffffffffffff640,&in_stack_fffffffffffff638->_name,
                 in_stack_fffffffffffff630);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator(&local_249);
      std::__cxx11::string::~string(local_220);
      std::allocator<char>::~allocator(&local_221);
      GroupNS::Parameter::set(in_stack_fffffffffffff6a0,data);
      GroupNS::Group::parameter((Group *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      GroupNS::Parameter::~Parameter(in_stack_fffffffffffff620);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
               (allocator<char> *)in_stack_fffffffffffff650);
    bVar1 = GroupNS::Group::isParameter(in_stack_fffffffffffff638,in_stack_fffffffffffff630);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator(&local_271);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      GroupNS::Parameter::Parameter
                (in_stack_fffffffffffff640,&in_stack_fffffffffffff638->_name,
                 in_stack_fffffffffffff630);
      std::__cxx11::string::~string(local_370);
      std::allocator<char>::~allocator(&local_371);
      std::__cxx11::string::~string(local_348);
      std::allocator<char>::~allocator(&local_349);
      local_38c = 1;
      local_388 = &local_38c;
      local_380 = 1;
      local_3a8 = 0;
      uStack_3a0 = 0;
      local_398 = 0;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x170308);
      __l._M_len = (size_type)in_stack_fffffffffffff640;
      __l._M_array = (iterator)in_stack_fffffffffffff638;
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630,__l);
      local_3c8 = 0;
      uStack_3c0 = 0;
      local_3b8 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x17035b);
      GroupNS::Parameter::set
                (in_stack_fffffffffffff660,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff658,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff650)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff630)
      ;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff630);
      GroupNS::Group::parameter((Group *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      GroupNS::Parameter::~Parameter(in_stack_fffffffffffff620);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
               (allocator<char> *)in_stack_fffffffffffff650);
    bVar1 = GroupNS::Group::isParameter(in_stack_fffffffffffff638,in_stack_fffffffffffff630);
    std::__cxx11::string::~string(local_3e8);
    std::allocator<char>::~allocator(&local_3e9);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      GroupNS::Parameter::Parameter
                (in_stack_fffffffffffff640,&in_stack_fffffffffffff638->_name,
                 in_stack_fffffffffffff630);
      std::__cxx11::string::~string(local_4e8);
      std::allocator<char>::~allocator(&local_4e9);
      std::__cxx11::string::~string(local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      group((Parameters *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      in_stack_fffffffffffff6c0 =
           GroupNS::Group::parameter((Group *)in_stack_fffffffffffff620,in_stack_fffffffffffff618);
      in_stack_fffffffffffff6b8 = GroupNS::Parameter::valuesAsDouble(in_stack_fffffffffffff650);
      local_558 = 0;
      uStack_550 = 0;
      local_548 = 0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x170726);
      in_stack_fffffffffffff6b0 =
           std::vector<double,_std::allocator<double>_>::operator=
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff6c0,
                      in_stack_fffffffffffff6b8);
      local_578 = 0;
      uStack_570 = 0;
      local_568 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x170771);
      GroupNS::Parameter::set
                (in_stack_fffffffffffff660,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff658,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff650)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff630)
      ;
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff630);
      std::__cxx11::string::~string(local_538);
      std::allocator<char>::~allocator(&local_539);
      std::__cxx11::string::~string(local_510);
      std::allocator<char>::~allocator(&local_511);
      GroupNS::Group::parameter((Group *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      GroupNS::Parameter::~Parameter(in_stack_fffffffffffff620);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
               (allocator<char> *)in_stack_fffffffffffff650);
    bVar1 = GroupNS::Group::isParameter(in_stack_fffffffffffff638,in_stack_fffffffffffff630);
    std::__cxx11::string::~string(local_598);
    std::allocator<char>::~allocator(&local_599);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)in_stack_fffffffffffff658,
                 (allocator<char> *)in_stack_fffffffffffff650);
      GroupNS::Parameter::Parameter
                (in_stack_fffffffffffff640,&in_stack_fffffffffffff638->_name,
                 in_stack_fffffffffffff630);
      std::__cxx11::string::~string(local_698);
      std::allocator<char>::~allocator((allocator<char> *)(local_6e8 + 0x4f));
      std::__cxx11::string::~string(local_670);
      std::allocator<char>::~allocator(&local_671);
      std::
      initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::initializer_list((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_6e8 + 0x38));
      local_6e8._32_8_ = 0;
      local_6e8._40_8_ = 0;
      local_6e8._48_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x170b33);
      __l_00._M_len = (size_type)in_stack_fffffffffffff640;
      __l_00._M_array = &in_stack_fffffffffffff638->_name;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffff630,__l_00);
      local_6e8._0_8_ = 0;
      local_6e8._8_8_ = 0;
      local_6e8._16_8_ = 0;
      in_stack_fffffffffffff660 = (Parameter *)local_6e8;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x170b7d);
      GroupNS::Parameter::set
                (in_stack_fffffffffffff6c0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff6b8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff6b0)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff630)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffff630);
      GroupNS::Group::parameter((Group *)in_stack_fffffffffffff660,in_stack_fffffffffffff658);
      GroupNS::Parameter::~Parameter(in_stack_fffffffffffff620);
    }
    p_00 = (Parameter *)local_709;
    pGVar3 = local_100;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffff660->_name,(char *)p_00,(allocator<char> *)pGVar3);
    bVar1 = GroupNS::Group::isParameter(in_stack_fffffffffffff638,in_stack_fffffffffffff630);
    std::__cxx11::string::~string((string *)(local_709 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_709);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      pPVar4 = (Parameter *)local_7e1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)p_00,(allocator<char> *)pGVar3);
      name = (string *)local_809;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffff660->_name,(char *)p_00,(allocator<char> *)pGVar3);
      GroupNS::Parameter::Parameter(pPVar4,name,in_stack_fffffffffffff630);
      std::__cxx11::string::~string((string *)(local_809 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_809);
      std::__cxx11::string::~string((string *)(local_7e1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_7e1);
      std::
      initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::initializer_list((initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)(local_858 + 0x38));
      local_858._32_8_ = 0;
      local_858._40_8_ = 0;
      local_858._48_8_ = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x170e6d);
      __l_01._M_len = (size_type)pPVar4;
      __l_01._M_array = name;
      this_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)in_stack_fffffffffffff630,__l_01);
      local_858._0_8_ = 0;
      local_858._8_8_ = 0;
      local_858._16_8_ = 0;
      pPVar4 = (Parameter *)local_858;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x170eb7);
      GroupNS::Parameter::set
                (in_stack_fffffffffffff6c0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff6b8,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff6b0)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(this_00);
      GroupNS::Group::parameter((Group *)in_stack_fffffffffffff660,p_00);
      GroupNS::Parameter::~Parameter(pPVar4);
    }
  }
  return;
}

Assistant:

void ezc3d::ParametersNS::Parameters::setMandatoryParametersForSpecialGroup(
    const std::string &groupName) {
  // Mandatory groups
  if (!groupName.compare("ROTATION")) {
    if (!isGroup("ROTATION")) {
      group(ezc3d::ParametersNS::GroupNS::Group("ROTATION"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("ROTATION"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      grp.parameter(p);
    }
    if (!grp.isParameter("DATA_START")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DATA_START", "");
      p.set(std::vector<int>() = {1});
      grp.parameter(p);
    }
    if (!grp.isParameter("RATE")) {
      // Double is better as default than RATIO as RATIO is chosen in
      // priority when writing.
      ezc3d::ParametersNS::GroupNS::Parameter p("RATE", "");
      p.set(std::vector<double>() =
                group("POINT").parameter("RATE").valuesAsDouble());
      grp.parameter(p);
    }
    if (!grp.isParameter("LABELS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("LABELS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("DESCRIPTIONS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DESCRIPTIONS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
  }
}